

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Unspill(CWriter *this,TypeVector *types)

{
  anon_class_8_1_a8b54799 local_20;
  TypeVector *local_18;
  TypeVector *types_local;
  CWriter *this_local;
  
  local_20.types = types;
  local_18 = types;
  types_local = (TypeVector *)this;
  (anonymous_namespace)::CWriter::
  Unspill<wabt::(anonymous_namespace)::CWriter::Unspill(std::vector<wabt::Type,std::allocator<wabt::Type>>const&)::__0>
            ((CWriter *)this,types,&local_20);
  return;
}

Assistant:

void CWriter::Unspill(const TypeVector& types) {
  Unspill(types, [&](auto i) { return StackVar(types.size() - i - 1); });
}